

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

unsigned_long * __thiscall
pstack::ReaderArray<unsigned_long,_131072UL>::getitem
          (ReaderArray<unsigned_long,_131072UL> *this,size_t idx)

{
  ulong uVar1;
  Exception *this_00;
  ulong uVar2;
  Exception local_1c0;
  
  if ((idx < this->cacheStart) || (uVar2 = this->cacheStart, this->cacheEnd <= idx)) {
    uVar1 = (**(code **)(*(long *)this->reader + 0x10))
                      (this->reader,idx * 8 + this->base,0x100000,&this->cache);
    this->cacheStart = idx;
    this->cacheEnd = (uVar1 >> 3) + idx;
    uVar2 = idx;
    if (uVar1 < 8) {
      this_00 = (Exception *)__cxa_allocate_exception(0x1a0);
      memset(&local_1c0,0,0x1a0);
      Exception::Exception(&local_1c0);
      std::operator<<((ostream *)&local_1c0.str,"end of data while reading array");
      Exception::Exception(this_00,&local_1c0);
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
  }
  return (unsigned_long *)((long)this + (idx - uVar2) * 8 + 0x28);
}

Assistant:

const T &ReaderArray<T, cachesize>::getitem(size_t idx) const {
   if (unlikely(cacheStart > idx || idx >= cacheEnd)) {
      size_t rc = reader.read(idx * sizeof(T) + base, cachesize * sizeof (T), reinterpret_cast<char *>(cache.data()));
      cacheStart = idx;
      cacheEnd = cacheStart + rc / sizeof(T);
      if (unlikely(rc < sizeof(T))) { // short read - consider this EOF.
         throw ( Exception() << "end of data while reading array" );
      }
   }
   return cache[idx - cacheStart];
}